

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int32_t bam_aux2i(uint8_t *s)

{
  uint8_t uVar1;
  uint *puVar2;
  int type;
  uint8_t *s_local;
  
  puVar2 = (uint *)(s + 1);
  uVar1 = *s;
  if (uVar1 == 'c') {
    s_local._4_4_ = (uint)(char)(byte)*puVar2;
  }
  else if (uVar1 == 'C') {
    s_local._4_4_ = (uint)(byte)*puVar2;
  }
  else if (uVar1 == 's') {
    s_local._4_4_ = (uint)(short)(ushort)*puVar2;
  }
  else if (uVar1 == 'S') {
    s_local._4_4_ = (uint)(ushort)*puVar2;
  }
  else if ((uVar1 == 'i') || (uVar1 == 'I')) {
    s_local._4_4_ = *puVar2;
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

int32_t bam_aux2i(const uint8_t *s)
{
    int type;
    type = *s++;
    if (type == 'c') return (int32_t)*(int8_t*)s;
    else if (type == 'C') return (int32_t)*(uint8_t*)s;
    else if (type == 's') return (int32_t)*(int16_t*)s;
    else if (type == 'S') return (int32_t)*(uint16_t*)s;
    else if (type == 'i' || type == 'I') return *(int32_t*)s;
    else return 0;
}